

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MDLImporter::CalcAbsBoneMatrices_3DGS_MDL7(MDLImporter *this,IntBone_MDL7 **apcOutBones)

{
  uchar *puVar1;
  IntBone_MDL7 *pIVar2;
  IntBone_MDL7 *pIVar3;
  uint uVar4;
  ai_uint32 aVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint32_t iBone;
  ulong uVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  if (apcOutBones == (IntBone_MDL7 **)0x0) {
    __assert_fail("__null != apcOutBones",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLLoader.cpp"
                  ,0x390,
                  "void Assimp::MDLImporter::CalcAbsBoneMatrices_3DGS_MDL7(MDL::IntBone_MDL7 **)");
  }
  puVar1 = this->mBuffer;
  if (*(int *)(puVar1 + 8) != 0) {
    uVar9 = 0xffff;
    uVar4 = 1;
    do {
      uVar10 = uVar9 & 0xffff;
      uVar11 = 0;
      do {
        uVar6 = (ulong)((uint)*(ushort *)(puVar1 + 0x1c) * (int)uVar11);
        if ((short)uVar9 == *(short *)(puVar1 + uVar6 + 0x30)) {
          pIVar2 = apcOutBones[uVar11];
          pIVar2->iParent = uVar10;
          if (uVar10 == 0xffff) {
            fVar13 = (pIVar2->super_aiBone).mOffsetMatrix.a4;
            fVar14 = (pIVar2->super_aiBone).mOffsetMatrix.b4;
            fVar15 = (pIVar2->super_aiBone).mOffsetMatrix.c4;
          }
          else {
            pIVar3 = apcOutBones[uVar10];
            fVar13 = -(pIVar3->vPosition).x;
            (pIVar2->super_aiBone).mOffsetMatrix.a4 = fVar13;
            fVar14 = -(pIVar3->vPosition).y;
            (pIVar2->super_aiBone).mOffsetMatrix.b4 = fVar14;
            fVar15 = -(pIVar3->vPosition).z;
            (pIVar2->super_aiBone).mOffsetMatrix.c4 = fVar15;
          }
          (pIVar2->vPosition).x = *(float *)(puVar1 + uVar6 + 0x34);
          (pIVar2->vPosition).y = *(float *)(puVar1 + uVar6 + 0x38);
          (pIVar2->vPosition).z = *(float *)(puVar1 + uVar6 + 0x3c);
          (pIVar2->super_aiBone).mOffsetMatrix.a4 = fVar13 - *(float *)(puVar1 + uVar6 + 0x34);
          (pIVar2->super_aiBone).mOffsetMatrix.b4 = fVar14 - *(float *)(puVar1 + uVar6 + 0x38);
          (pIVar2->super_aiBone).mOffsetMatrix.c4 = fVar15 - *(float *)(puVar1 + uVar6 + 0x3c);
          if (*(ushort *)(puVar1 + 0x1c) == 0x10) {
            aVar5 = snprintf((pIVar2->super_aiBone).mName.data,0x400,"UnnamedBone_%i",
                             uVar11 & 0xffffffff);
            (pIVar2->super_aiBone).mName.length = aVar5;
          }
          else {
            uVar7 = *(ushort *)(puVar1 + 0x1c) - 0x10;
            if (uVar7 == 0) {
              uVar7 = 0;
            }
            else {
              uVar8 = 0;
              do {
                if (puVar1[uVar8 + uVar6 + 0x40] == '\0') {
                  uVar7 = (uint)uVar8;
                  break;
                }
                uVar8 = uVar8 + 1;
              } while (uVar7 != uVar8);
            }
            (pIVar2->super_aiBone).mName.length = uVar7;
            memcpy((pIVar2->super_aiBone).mName.data,puVar1 + uVar6 + 0x40,(ulong)uVar7);
            (pIVar2->super_aiBone).mName.data[uVar7] = '\0';
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < *(uint *)(puVar1 + 8));
      uVar9 = (ulong)((int)uVar10 + 1);
      bVar12 = uVar4 < *(uint *)(puVar1 + 8);
      uVar4 = uVar4 + 1;
    } while (bVar12);
  }
  return;
}

Assistant:

void MDLImporter::CalcAbsBoneMatrices_3DGS_MDL7(MDL::IntBone_MDL7** apcOutBones)
{
    const MDL::Header_MDL7 *pcHeader = (const MDL::Header_MDL7*)this->mBuffer;
    const MDL::Bone_MDL7* pcBones = (const MDL::Bone_MDL7*)(pcHeader+1);
    ai_assert(NULL != apcOutBones);

    // first find the bone that has NO parent, calculate the
    // animation matrix for it, then go on and search for the next parent
    // index (0) and so on until we can't find a new node.
    uint16_t iParent = 0xffff;
    uint32_t iIterations = 0;
    while (iIterations++ < pcHeader->bones_num) {
        for (uint32_t iBone = 0; iBone < pcHeader->bones_num;++iBone)   {
            BE_NCONST MDL::Bone_MDL7* pcBone = _AI_MDL7_ACCESS_PTR(pcBones,iBone,
                pcHeader->bone_stc_size,MDL::Bone_MDL7);

            AI_SWAP2(pcBone->parent_index);
            AI_SWAP4(pcBone->x);
            AI_SWAP4(pcBone->y);
            AI_SWAP4(pcBone->z);

            if (iParent == pcBone->parent_index)    {
                // MDL7 readme
                ////////////////////////////////////////////////////////////////
                /*
                The animation matrix is then calculated the following way:

                vector3 bPos = <absolute bone position>
                matrix44 laM;   // local animation matrix
                sphrvector key_rotate = <bone rotation>

                matrix44 m1,m2;
                create_trans_matrix(m1, -bPos.x, -bPos.y, -bPos.z);
                create_trans_matrix(m2, -bPos.x, -bPos.y, -bPos.z);

                create_rotation_matrix(laM,key_rotate);

                laM = sm1 * laM;
                laM = laM * sm2;
                */
                /////////////////////////////////////////////////////////////////

                MDL::IntBone_MDL7* const pcOutBone = apcOutBones[iBone];

                // store the parent index of the bone
                pcOutBone->iParent = pcBone->parent_index;
                if (0xffff != iParent)  {
                    const MDL::IntBone_MDL7* pcParentBone = apcOutBones[iParent];
                    pcOutBone->mOffsetMatrix.a4 = -pcParentBone->vPosition.x;
                    pcOutBone->mOffsetMatrix.b4 = -pcParentBone->vPosition.y;
                    pcOutBone->mOffsetMatrix.c4 = -pcParentBone->vPosition.z;
                }
                pcOutBone->vPosition.x = pcBone->x;
                pcOutBone->vPosition.y = pcBone->y;
                pcOutBone->vPosition.z = pcBone->z;
                pcOutBone->mOffsetMatrix.a4 -= pcBone->x;
                pcOutBone->mOffsetMatrix.b4 -= pcBone->y;
                pcOutBone->mOffsetMatrix.c4 -= pcBone->z;

                if (AI_MDL7_BONE_STRUCT_SIZE__NAME_IS_NOT_THERE == pcHeader->bone_stc_size) {
                    // no real name for our poor bone is specified :-(
                    pcOutBone->mName.length = ai_snprintf(pcOutBone->mName.data, MAXLEN,
                        "UnnamedBone_%i",iBone);
                }
                else    {
                    // Make sure we won't run over the buffer's end if there is no
                    // terminal 0 character (however the documentation says there
                    // should be one)
                    uint32_t iMaxLen = pcHeader->bone_stc_size-16;
                    for (uint32_t qq = 0; qq < iMaxLen;++qq)    {
                        if (!pcBone->name[qq])  {
                            iMaxLen = qq;
                            break;
                        }
                    }

                    // store the name of the bone
                    pcOutBone->mName.length = (size_t)iMaxLen;
                    ::memcpy(pcOutBone->mName.data,pcBone->name,pcOutBone->mName.length);
                    pcOutBone->mName.data[pcOutBone->mName.length] = '\0';
                }
            }
        }
        ++iParent;
    }
}